

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

string * __thiscall
t_swift_generator::function_args_helper_struct_type_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_service *tservice,
          t_function *tfunction)

{
  int iVar1;
  undefined4 extraout_var;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  t_function *local_28;
  t_function *tfunction_local;
  t_service *tservice_local;
  t_swift_generator *this_local;
  
  local_28 = tfunction;
  tfunction_local = (t_function *)tservice;
  tservice_local = (t_service *)this;
  this_local = (t_swift_generator *)__return_storage_ptr__;
  iVar1 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1),"_");
  __rhs = t_function::get_name_abi_cxx11_(local_28);
  std::operator+(&local_48,&local_68,__rhs);
  std::operator+(__return_storage_ptr__,&local_48,"_args");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::function_args_helper_struct_type(t_service *tservice, t_function* tfunction) {
  return tservice->get_name() + "_" + tfunction->get_name() + "_args";
}